

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeIndex
          (BinaryReaderObjdumpDisassemble *this,Index value)

{
  Enum EVar1;
  size_t data_size;
  string_view sVar2;
  
  data_size = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
               super_BinaryReaderDelegate.state)->offset - this->current_opcode_offset;
  EVar1 = (this->current_opcode).enum_;
  if (EVar1 == Call) {
    sVar2 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,value);
    if (sVar2.size_ == 0) {
      EVar1 = (this->current_opcode).enum_;
      goto LAB_00129eb0;
    }
LAB_00129ec7:
    LogOpcode(this,data_size,"%d <%.*s>",value,sVar2.size_,sVar2.data_);
  }
  else {
LAB_00129eb0:
    if ((EVar1 & ~Nop) == GlobalGet) {
      sVar2 = BinaryReaderObjdumpBase::GetGlobalName(&this->super_BinaryReaderObjdumpBase,value);
      if (sVar2.size_ != 0) goto LAB_00129ec7;
    }
    LogOpcode(this,data_size,"%d",value);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeIndex(Index value) {
  Offset immediate_len = state->offset - current_opcode_offset;
  string_view name;
  if (current_opcode == Opcode::Call &&
      !(name = GetFunctionName(value)).empty()) {
    LogOpcode(immediate_len, "%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::GlobalGet ||
              current_opcode == Opcode::GlobalSet) &&
             !(name = GetGlobalName(value)).empty()) {
    LogOpcode(immediate_len, "%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode(immediate_len, "%d", value);
  }
  return Result::Ok;
}